

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O1

bool __thiscall
ON_Line::Rotate(ON_Line *this,double sin_angle,double cos_angle,ON_3dVector *axis,ON_3dPoint *center
               )

{
  ON_3dPoint *this_00;
  double dVar1;
  bool bVar2;
  bool bVar3;
  ON_Xform rot;
  ON_3dPoint local_c8;
  ON_Xform local_b0;
  
  ON_Xform::ON_Xform(&local_b0);
  ON_Xform::Rotation(&local_b0,sin_angle,cos_angle,*axis,*center);
  bVar2 = ON_3dPoint::operator==(&this->from,center);
  this_00 = &this->to;
  bVar3 = ON_3dPoint::operator==(this_00,center);
  ON_Xform::operator*(&local_c8,&local_b0,&this->from);
  (this->from).z = local_c8.z;
  (this->from).x = local_c8.x;
  (this->from).y = local_c8.y;
  ON_Xform::operator*(&local_c8,&local_b0,this_00);
  (this->to).z = local_c8.z;
  (this->to).x = local_c8.x;
  (this->to).y = local_c8.y;
  if (bVar2) {
    (this->from).z = center->z;
    dVar1 = center->y;
    (this->from).x = center->x;
    (this->from).y = dVar1;
  }
  if (bVar3) {
    (this->to).z = center->z;
    dVar1 = center->y;
    this_00->x = center->x;
    (this->to).y = dVar1;
  }
  return true;
}

Assistant:

bool ON_Line::Rotate(
      double sin_angle,                  // sin(angle)
      double cos_angle,                  // cos(angle)
      const ON_3dVector& axis,  // axis of rotation
      const ON_3dPoint& center  // center of rotation
      )
{
  ON_Xform rot;
  rot.Rotation( sin_angle, cos_angle, axis, center );
  const bool bFixP0 = (from==center);
  const bool bFixP1 = (to==center);
  const bool rc = Transform( rot );
  if ( bFixP0 )
    from = center;
  if ( bFixP1 )
    to = center;
  return rc;
}